

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::emitGlobalType(PrintSExpression *this,Global *curr)

{
  ostream *poVar1;
  Global *curr_local;
  PrintSExpression *this_local;
  
  if ((curr->mutable_ & 1U) == 0) {
    printType(this,(Type)(curr->type).id);
  }
  else {
    std::operator<<(this->o,"(mut ");
    poVar1 = printType(this,(Type)(curr->type).id);
    std::operator<<(poVar1,')');
  }
  return;
}

Assistant:

void PrintSExpression::emitGlobalType(Global* curr) {
  if (curr->mutable_) {
    o << "(mut ";
    printType(curr->type) << ')';
  } else {
    printType(curr->type);
  }
}